

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

void __thiscall QFontDialogPrivate::updateSizes(QFontDialogPrivate *this)

{
  QWidget *this_00;
  QAbstractItemView *pQVar1;
  QArrayData *pQVar2;
  QLineEdit *pQVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  QAbstractItemModel *pQVar7;
  QStyle *pQVar8;
  int *piVar9;
  QLineEdit *this_01;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_a8;
  QArrayData *local_88;
  int *piStack_80;
  undefined1 *local_78;
  QString local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_50,pQVar1);
  lVar11 = (long)local_50.r;
  if (-1 < lVar11) {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    pQVar2 = *(QArrayData **)(local_50.i + lVar11 * 0x18);
    lVar11 = *(long *)(local_50.i + lVar11 * 0x18 + 0x10);
    if (pQVar2 == (QArrayData *)0x0) {
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
    }
    else {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (lVar11 != 0) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      piStack_80 = (int *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (QAbstractItemView *)this->familyList;
      QAbstractItemView::currentIndex(&local_50,pQVar1);
      lVar11 = (long)local_50.r;
      if (lVar11 < 0) {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
      }
      else {
        QAbstractItemView::model(pQVar1);
        QStringListModel::stringList();
        local_68.d.d = *(Data **)(local_50.i + lVar11 * 0x18);
        local_68.d.ptr = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
        local_68.d.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
      }
      pQVar1 = (QAbstractItemView *)this->styleList;
      QAbstractItemView::currentIndex(&local_50,pQVar1);
      lVar11 = (long)local_50.r;
      if (lVar11 < 0) {
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (QString *)0x0;
        local_a8.size = 0;
      }
      else {
        QAbstractItemView::model(pQVar1);
        QStringListModel::stringList();
        local_a8.d = *(Data **)(local_50.i + lVar11 * 0x18);
        local_a8.ptr = *(QString **)(local_50.i + lVar11 * 0x18 + 8);
        local_a8.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
        if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
      }
      QFontDatabase::pointSizes((QString *)&local_88,(QString *)&local_68);
      if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (QString *)0x0;
      local_a8.size = 0;
      QList<QString>::reserve((QList<QString> *)&local_a8,(qsizetype)local_78);
      if (local_78 == (undefined1 *)0x0) {
        iVar6 = -1;
      }
      else {
        iVar6 = -1;
        iVar10 = 0;
        piVar9 = piStack_80;
        do {
          QString::number((int)&local_50,*piVar9);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&local_a8,local_a8.size,(QString *)&local_50);
          QList<QString>::end((QList<QString> *)&local_a8);
          piVar4 = (int *)CONCAT44(local_50.c,local_50.r);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_50.c,local_50.r),2,0x10);
            }
          }
          if ((iVar6 == -1) && (iVar6 = -1, *piVar9 == this->size)) {
            iVar6 = iVar10;
          }
          iVar10 = iVar10 + 1;
          piVar9 = piVar9 + 1;
        } while (piVar9 != piStack_80 + (long)local_78);
      }
      pQVar7 = QAbstractItemView::model((QAbstractItemView *)this->sizeList);
      QStringListModel::setStringList((QList_conflict *)pQVar7);
      if (iVar6 != -1) {
        pQVar1 = (QAbstractItemView *)this->sizeList;
        pQVar7 = QAbstractItemView::model(pQVar1);
        local_68.d.d = (Data *)0xffffffffffffffff;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        (**(code **)(*(long *)pQVar7 + 0x60))(&local_50,pQVar7,iVar6,0);
        QAbstractItemView::setCurrentIndex(pQVar1,&local_50);
      }
      pQVar3 = this->sizeEdit;
      if (pQVar3 == (QLineEdit *)0x0) {
        this_01 = (QLineEdit *)0x0;
      }
      else {
        QObject::blockSignals(SUB81(pQVar3,0));
        this_01 = this->sizeEdit;
      }
      if (this->smoothScalable == true) {
        QString::number((int)&local_68,this->size);
      }
      else {
        pQVar1 = (QAbstractItemView *)this->sizeList;
        QAbstractItemView::currentIndex(&local_50,pQVar1);
        lVar11 = (long)local_50.r;
        if (lVar11 < 0) {
          local_68.d.d = (Data *)0x0;
          local_68.d.ptr = (char16_t *)0x0;
          local_68.d.size = 0;
        }
        else {
          QAbstractItemView::model(pQVar1);
          QStringListModel::stringList();
          local_68.d.d = *(Data **)(local_50.i + lVar11 * 0x18);
          local_68.d.ptr = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
          local_68.d.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
        }
      }
      QLineEdit::setText(this_01,&local_68);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar8 = QWidget::style(this_00);
      iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0xd,0,this_00,0);
      if ((iVar6 != 0) && (bVar5 = QWidget::hasFocus((QWidget *)this->sizeList), bVar5)) {
        QLineEdit::selectAll(this->sizeEdit);
      }
      if (pQVar3 != (QLineEdit *)0x0) {
        QObject::blockSignals(SUB81(pQVar3,0));
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,4,0x10);
        }
      }
      goto LAB_004fc084;
    }
  }
  QLineEdit::clear(this->sizeEdit);
LAB_004fc084:
  updateSample(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateSizes()
{
    Q_Q(QFontDialog);

    if (!familyList->currentText().isEmpty()) {
        QList<int> sizes = QFontDatabase::pointSizes(familyList->currentText(), styleList->currentText());

        int i = 0;
        int current = -1;
        QStringList str_sizes;
        str_sizes.reserve(sizes.size());
        for(QList<int>::const_iterator it = sizes.constBegin(); it != sizes.constEnd(); ++it) {
            str_sizes.append(QString::number(*it));
            if (current == -1 && *it == size)
                current = i;
            ++i;
        }
        sizeList->model()->setStringList(str_sizes);
        if (current != -1)
            sizeList->setCurrentItem(current);

        const QSignalBlocker blocker(sizeEdit);
        sizeEdit->setText((smoothScalable ? QString::number(size) : sizeList->currentText()));
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && sizeList->hasFocus())
            sizeEdit->selectAll();
    } else {
        sizeEdit->clear();
    }

    updateSample();
}